

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall helics::CoreBroker::processQuery(CoreBroker *this,ActionMessage *message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_t vVar2;
  ConnectionState CVar3;
  size_t __n;
  byte *pbVar4;
  json_value jVar5;
  size_t sVar6;
  json *__s1;
  undefined8 uVar7;
  int iVar8;
  route_id rVar9;
  string *this_00;
  iterator iVar10;
  iterator iVar11;
  reference pvVar12;
  string *psVar13;
  char *__s;
  action_t startingAction;
  _Hash_node_base *p_Var14;
  _Alloc_hider _Var15;
  char *in_R8;
  size_type __len2;
  size_type __rlen;
  pointer this_01;
  pointer pBVar16;
  uint uVar17;
  uint uVar18;
  size_type __rlen_4;
  bool bVar19;
  string_view query;
  string_view gidString;
  string response;
  json json;
  ActionMessage queryResp;
  undefined1 local_220 [64];
  json *local_1e0;
  string local_1d8;
  string local_1b8;
  data local_198;
  undefined1 local_188 [8];
  pointer local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178 [3];
  SmallBuffer local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  key_type local_b0;
  string local_90;
  data local_70;
  data local_60;
  string local_50;
  
  startingAction = cmd_query_reply;
  if ((message->messageAction & cmd_priority_disconnect) == cmd_query_ordered) {
    startingAction = cmd_query_reply_ordered;
  }
  this_00 = ActionMessage::getString_abi_cxx11_(message,0);
  __n = this_00->_M_string_length;
  if ((((__n == (this->super_BrokerBase).identifier._M_string_length) &&
       ((__n == 0 ||
        (iVar8 = bcmp((this_00->_M_dataplus)._M_p,
                      (this->super_BrokerBase).identifier._M_dataplus._M_p,__n), iVar8 == 0)))) ||
      (iVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         this_00,"broker"), iVar8 == 0)) ||
     (((this->super_BrokerBase).field_0x294 == '\x01' &&
      ((iVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          this_00,"root"), iVar8 == 0 ||
       (iVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          this_00,"federation"), iVar8 == 0)))))) {
    processLocalQuery(this,message);
    return;
  }
  if (((this->super_BrokerBase).field_0x294 == '\x01') &&
     (iVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                      "gid_to_name"), iVar8 == 0)) {
    ActionMessage::ActionMessage((ActionMessage *)local_188,startingAction);
    local_178[0]._0_4_ = (message->source_id).gid;
    local_180 = (pointer)CONCAT44(local_180._4_4_,
                                  (this->super_BrokerBase).global_broker_id_local.gid);
    local_188._4_4_ = message->messageID;
    gidString._M_str = (char *)(message->payload).heap;
    gidString._M_len = (message->payload).bufferSize;
    getNameList_abi_cxx11_((string *)local_220,this,gidString);
    uVar7 = local_220._0_8_;
    if ((byte *)local_220._0_8_ == local_148.heap) {
      local_148.bufferSize = local_220._8_8_;
    }
    else {
      SmallBuffer::reserve(&local_148,local_220._8_8_);
      local_148.bufferSize = local_220._8_8_;
      if (local_220._8_8_ != 0) {
        memcpy(local_148.heap,(void *)uVar7,local_220._8_8_);
      }
    }
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_220 + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._0_8_ != paVar1) {
      operator_delete((void *)local_220._0_8_,CONCAT71(local_220._17_7_,local_220[0x10]) + 1);
    }
    if ((undefined4)local_178[0]._M_allocated_capacity !=
        (this->super_BrokerBase).global_broker_id_local.gid) {
      rVar9 = getRoute(this,(GlobalFederateId)local_178[0]._0_4_);
      (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)rVar9.rid,local_188);
      goto LAB_00343b1d;
    }
    iVar8 = message->messageID;
    local_220._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_220,local_148.heap,local_148.heap + local_148.bufferSize);
    gmlc::concurrency::
    DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::setDelayedValue(&this->activeQueries,iVar8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220
                     );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._0_8_ == paVar1) goto LAB_00343b1d;
  }
  else {
    if (((this->super_BrokerBase).field_0x294 != '\x01') ||
       ((iVar8 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this_00,"global"), iVar8 != 0 &&
        (iVar8 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this_00,"global_value"), iVar8 != 0)))) {
      local_180 = (this_00->_M_dataplus)._M_p;
      local_188 = (undefined1  [8])this_00->_M_string_length;
      iVar10 = std::
               _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&(this->mFederates).lookup1,(key_type *)local_188);
      if (iVar10.
          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
          ._M_cur == (__node_type *)0x0) {
        pBVar16 = (this->mFederates).dataStorage.
                  super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        pBVar16 = (this->mFederates).dataStorage.
                  super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start +
                  *(long *)((long)iVar10.
                                  super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                                  ._M_cur + 0x18);
      }
      local_220._0_8_ = local_220 + 0x10;
      local_220._8_8_ = 0;
      local_220[0x10] = '\0';
      if (pBVar16 ==
          (this->mFederates).dataStorage.
          super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_180 = (this_00->_M_dataplus)._M_p;
        local_188 = (undefined1  [8])this_00->_M_string_length;
        iVar10 = std::
                 _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&(this->mBrokers).lookup1,(key_type *)local_188);
        if (iVar10.
            super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
            ._M_cur == (__node_type *)0x0) {
          this_01 = (this->mBrokers).dataStorage.
                    super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          this_01 = (this->mBrokers).dataStorage.
                    super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                    *(long *)((long)iVar10.
                                    super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                                    ._M_cur + 0x18);
        }
        if (this_01 ==
            (this->mBrokers).dataStorage.
            super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          uVar17 = 0;
          uVar18 = 0;
          if ((((this->super_BrokerBase).field_0x294 == '\x01') &&
              (uVar18 = uVar17, (message->payload).bufferSize == 6)) &&
             (iVar8 = bcmp((message->payload).heap,"exists",6), iVar8 == 0)) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220
                      ,"false");
          }
        }
        else {
          uVar18 = (this_01->route).rid;
          (message->dest_id).gid = (this_01->global_id).gid;
          query._M_str = in_R8;
          query._M_len = (size_t)(message->payload).heap;
          checkBrokerQuery_abi_cxx11_
                    ((string *)local_188,(helics *)this_01,
                     (BasicBrokerInfo *)(message->payload).bufferSize,query);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
          if (local_188 != (undefined1  [8])local_178) {
            operator_delete((void *)local_188,
                            CONCAT44(local_178[0]._M_allocated_capacity._4_4_,
                                     (undefined4)local_178[0]._M_allocated_capacity) + 1);
          }
          if ((local_220._8_8_ == 0) && (CVar3 = this_01->state, 0x27 < CVar3)) {
            uVar18 = 0;
            if (CVar3 == ERROR_STATE) {
              local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1b8,"target broker is in error state","");
              generateJsonErrorResponse(&local_1d8,SERVICE_UNAVAILABLE,&local_1b8);
              processQuery();
            }
            else if ((CVar3 == REQUEST_DISCONNECT) || (CVar3 == DISCONNECTED)) {
              local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1b8,"federate is disconnected","");
              generateJsonErrorResponse(&local_1d8,SERVICE_UNAVAILABLE,&local_1b8);
              processQuery();
            }
          }
        }
        goto LAB_00343c4e;
      }
      uVar18 = (pBVar16->route).rid;
      (message->dest_id).gid = (pBVar16->parent).gid;
      sVar6 = (message->payload).bufferSize;
      __s1 = (json *)(message->payload).heap;
      local_188 = (undefined1  [8])local_178;
      local_180 = (pointer)0x0;
      local_178[0]._M_allocated_capacity._0_4_ =
           (undefined4)local_178[0]._M_allocated_capacity & 0xffffff00;
      if (sVar6 == 5) {
        local_180 = (pointer)0x0;
        local_220[0x10] = '\0';
        local_220._8_8_ = 0;
        local_1e0 = __s1;
        iVar8 = bcmp(__s1,"state",5);
        if (iVar8 != 0) goto LAB_00343bbd;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                  '\"');
        psVar13 = stateString_abi_cxx11_(pBVar16->state);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                  (psVar13->_M_dataplus)._M_p,psVar13->_M_string_length);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                  '\"');
      }
      else {
        if (sVar6 == 0xb) {
          local_180 = (pointer)0x0;
          local_220[0x10] = '\0';
          local_220._8_8_ = 0;
          local_1e0 = __s1;
          iVar8 = bcmp(__s1,"isconnected",0xb);
          if (iVar8 != 0) goto LAB_00343bbd;
          bVar19 = pBVar16->state < (OPERATING|INIT_REQUESTED);
          __s = "false";
          if (bVar19) {
            __s = "true";
          }
          __len2 = 5 - (ulong)bVar19;
        }
        else {
          if (sVar6 == 6) {
            local_1e0 = __s1;
            iVar8 = bcmp(__s1,"exists",6);
            if (iVar8 != 0) {
              iVar8 = bcmp(local_1e0,"isinit",6);
              bVar19 = iVar8 == 0;
              goto LAB_00343bbf;
            }
          }
          else {
LAB_00343bbd:
            bVar19 = false;
LAB_00343bbf:
            if ((!bVar19) || (pBVar16->state < OPERATING)) goto LAB_00343be8;
          }
          __len2 = 4;
          __s = "true";
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,0,
                   0,__s,__len2);
      }
LAB_00343be8:
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
      if (local_188 != (undefined1  [8])local_178) {
        operator_delete((void *)local_188,
                        CONCAT44(local_178[0]._M_allocated_capacity._4_4_,
                                 (undefined4)local_178[0]._M_allocated_capacity) + 1);
      }
      if ((local_220._8_8_ == 0) && (CVar3 = pBVar16->state, 0x27 < CVar3)) {
        uVar18 = 0;
        if (CVar3 == ERROR_STATE) {
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1b8,"federate is in error state","");
          generateJsonErrorResponse(&local_1d8,SERVICE_UNAVAILABLE,&local_1b8);
          processQuery();
        }
        else if ((CVar3 == REQUEST_DISCONNECT) || (CVar3 == DISCONNECTED)) {
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1b8,"federate is disconnected","");
          generateJsonErrorResponse(&local_1d8,SERVICE_UNAVAILABLE,&local_1b8);
          processQuery();
        }
      }
LAB_00343c4e:
      if (((uVar18 == 0) && ((this->super_BrokerBase).field_0x294 != '\0')) ||
         (local_220._8_8_ != 0)) {
        if (local_220._8_8_ == 0) {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"query not valid","");
          generateJsonErrorResponse(&local_50,NOT_FOUND,&local_90);
          processQuery();
        }
        ActionMessage::ActionMessage((ActionMessage *)local_188,startingAction);
        local_148.bufferSize = local_220._8_8_;
        uVar7 = local_220._0_8_;
        local_178[0]._0_4_ = (message->source_id).gid;
        local_180 = (pointer)CONCAT44(local_180._4_4_,
                                      (this->super_BrokerBase).global_broker_id_local.gid);
        local_188._4_4_ = message->messageID;
        if ((byte *)local_220._0_8_ == local_148.heap) {
        }
        else {
          SmallBuffer::reserve(&local_148,local_220._8_8_);
          if (local_148.bufferSize != 0) {
            memcpy(local_148.heap,(void *)uVar7,local_148.bufferSize);
          }
        }
        if ((undefined4)local_178[0]._M_allocated_capacity ==
            (this->super_BrokerBase).global_broker_id_local.gid) {
          iVar8 = message->messageID;
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,local_148.heap,local_148.heap + local_148.bufferSize);
          gmlc::concurrency::
          DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::setDelayedValue(&this->activeQueries,iVar8,&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          rVar9 = getRoute(this,(GlobalFederateId)local_178[0]._0_4_);
          (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)rVar9.rid,local_188);
        }
        ActionMessage::~ActionMessage((ActionMessage *)local_188);
      }
      else {
        if ((message->source_id).gid == (this->super_BrokerBase).global_broker_id_local.gid) {
          if ((this->queryTimeouts).
              super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              (this->queryTimeouts).
              super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            BrokerBase::setTickForwarding(&this->super_BrokerBase,QUERY_TIMEOUT,true);
          }
          local_188 = (undefined1  [8])std::chrono::_V2::steady_clock::now();
          std::
          deque<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
          ::
          emplace_back<int&,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                    ((deque<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
                      *)&this->queryTimeouts,&message->messageID,
                     (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)local_188);
        }
        (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)uVar18,message);
      }
      if ((undefined1 *)local_220._0_8_ == local_220 + 0x10) {
        return;
      }
      operator_delete((void *)local_220._0_8_,CONCAT71(local_220._17_7_,local_220[0x10]) + 1);
      return;
    }
    ActionMessage::ActionMessage((ActionMessage *)local_188,startingAction);
    local_178[0]._0_4_ = (message->source_id).gid;
    local_180 = (pointer)CONCAT44(local_180._4_4_,
                                  (this->super_BrokerBase).global_broker_id_local.gid);
    local_188._4_4_ = message->messageID;
    pbVar4 = (message->payload).heap;
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_220 + 0x10);
    local_220._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_220,pbVar4,pbVar4 + (message->payload).bufferSize);
    iVar11 = CLI::std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->global_values)._M_h,(key_type *)local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._0_8_ != paVar1) {
      operator_delete((void *)local_220._0_8_,CONCAT71(local_220._17_7_,local_220[0x10]) + 1);
    }
    if (iVar11.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      sVar6 = (message->payload).bufferSize;
      pbVar4 = (message->payload).heap;
      if (sVar6 == 3) {
        iVar8 = bcmp(pbVar4,"all",3);
        if (iVar8 != 0) goto LAB_0034365a;
        fileops::JsonMapBuilder::JsonMapBuilder((JsonMapBuilder *)local_220);
        local_1e0 = fileops::JsonMapBuilder::getJValue_abi_cxx11_((JsonMapBuilder *)local_220);
        p_Var14 = (this->global_values)._M_h._M_before_begin._M_nxt;
        if (p_Var14 != (_Hash_node_base *)0x0) {
          do {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_198,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var14 + 5));
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b0,p_Var14[1]._M_nxt,
                       (long)&(p_Var14[2]._M_nxt)->_M_nxt + (long)p_Var14[1]._M_nxt);
            pvVar12 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::operator[](local_1e0,&local_b0);
            vVar2 = (pvVar12->m_data).m_type;
            (pvVar12->m_data).m_type = local_198.m_type;
            jVar5 = (pvVar12->m_data).m_value;
            (pvVar12->m_data).m_value = local_198.m_value;
            local_198.m_type = vVar2;
            local_198.m_value = jVar5;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_198);
            p_Var14 = p_Var14->_M_nxt;
          } while (p_Var14 != (_Hash_node_base *)0x0);
        }
        fileops::JsonMapBuilder::generate_abi_cxx11_(&local_1d8,(JsonMapBuilder *)local_220);
        SmallBuffer::operator=(&local_148,&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        fileops::JsonMapBuilder::~JsonMapBuilder((JsonMapBuilder *)local_220);
      }
      else {
        if ((sVar6 == 4) && (iVar8 = bcmp(pbVar4,"list",4), iVar8 == 0)) {
          generateStringVector<std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,helics::CoreBroker::processQuery(helics::ActionMessage&)::__0>
                    (local_220,&this->global_values);
          SmallBuffer::operator=
                    (&local_148,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._0_8_ == paVar1) goto LAB_00343a9a;
          local_1d8.field_2._M_allocated_capacity = CONCAT71(local_220._17_7_,local_220[0x10]);
          _Var15._M_p = (pointer)local_220._0_8_;
        }
        else {
LAB_0034365a:
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d8,"Global value not found","");
          generateJsonErrorResponse((string *)local_220,NOT_FOUND,&local_1d8);
          SmallBuffer::operator=
                    (&local_148,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._0_8_ != paVar1) {
            operator_delete((void *)local_220._0_8_,CONCAT71(local_220._17_7_,local_220[0x10]) + 1);
          }
          _Var15._M_p = local_1d8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p == &local_1d8.field_2) goto LAB_00343a9a;
        }
        operator_delete(_Var15._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      iVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                      "global_value");
      if (iVar8 == 0) {
        SmallBuffer::operator=
                  (&local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)iVar11.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                          ._M_cur + 0x28));
      }
      else {
        local_1d8._M_dataplus._M_p = local_1d8._M_dataplus._M_p & 0xffffffffffffff00;
        local_1d8._M_string_length = 0;
        pbVar4 = (message->payload).heap;
        local_220._0_8_ = paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_220,pbVar4,pbVar4 + (message->payload).bufferSize);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220);
        pvVar12 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_1d8,"name");
        vVar2 = (pvVar12->m_data).m_type;
        (pvVar12->m_data).m_type = local_60.m_type;
        jVar5 = (pvVar12->m_data).m_value;
        (pvVar12->m_data).m_value = local_60.m_value;
        local_60.m_type = vVar2;
        local_60.m_value = jVar5;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._0_8_ != paVar1) {
          operator_delete((void *)local_220._0_8_,CONCAT71(local_220._17_7_,local_220[0x10]) + 1);
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)iVar11.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                          ._M_cur + 0x28));
        pvVar12 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_1d8,"value");
        vVar2 = (pvVar12->m_data).m_type;
        (pvVar12->m_data).m_type = local_70.m_type;
        jVar5 = (pvVar12->m_data).m_value;
        (pvVar12->m_data).m_value = local_70.m_value;
        local_70.m_type = vVar2;
        local_70.m_value = jVar5;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_70);
        fileops::generateJsonString((string *)local_220,(json *)&local_1d8,true);
        SmallBuffer::operator=
                  (&local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._0_8_ != paVar1) {
          operator_delete((void *)local_220._0_8_,CONCAT71(local_220._17_7_,local_220[0x10]) + 1);
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)&local_1d8);
      }
    }
LAB_00343a9a:
    if ((undefined4)local_178[0]._M_allocated_capacity !=
        (this->super_BrokerBase).global_broker_id_local.gid) {
      rVar9 = getRoute(this,(GlobalFederateId)local_178[0]._0_4_);
      (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)rVar9.rid,local_188);
      goto LAB_00343b1d;
    }
    iVar8 = message->messageID;
    local_220._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_220 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_220,local_148.heap,local_148.heap + local_148.bufferSize);
    gmlc::concurrency::
    DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::setDelayedValue(&this->activeQueries,iVar8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220
                     );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_220 + 0x10)) goto LAB_00343b1d;
  }
  operator_delete((void *)local_220._0_8_,CONCAT71(local_220._17_7_,local_220[0x10]) + 1);
LAB_00343b1d:
  ActionMessage::~ActionMessage((ActionMessage *)local_188);
  return;
}

Assistant:

void CoreBroker::processQuery(ActionMessage& message)
{
    const bool force_ordered =
        (message.action() == CMD_QUERY_ORDERED || message.action() == CMD_BROKER_QUERY_ORDERED);
    const auto& target = message.getString(targetStringLoc);
    if ((target == getIdentifier() || target == "broker") ||
        (isRootc && (target == "root" || target == "federation"))) {
        processLocalQuery(message);
    } else if (isRootc && target == "gid_to_name") {
        ActionMessage queryResp(force_ordered ? CMD_QUERY_REPLY_ORDERED : CMD_QUERY_REPLY);
        queryResp.dest_id = message.source_id;
        queryResp.source_id = global_broker_id_local;
        queryResp.messageID = message.messageID;
        queryResp.payload = getNameList(message.payload.to_string());
        if (queryResp.dest_id == global_broker_id_local) {
            activeQueries.setDelayedValue(message.messageID,
                                          std::string(queryResp.payload.to_string()));
        } else {
            transmit(getRoute(queryResp.dest_id), queryResp);
        }
    } else if ((isRootc) && (target == "global" || target == "global_value")) {
        ActionMessage queryResp(force_ordered ? CMD_QUERY_REPLY_ORDERED : CMD_QUERY_REPLY);
        queryResp.dest_id = message.source_id;
        queryResp.source_id = global_broker_id_local;
        queryResp.messageID = message.messageID;

        auto gfind = global_values.find(std::string(message.payload.to_string()));
        if (gfind != global_values.end()) {
            if (target == "global_value") {
                queryResp.payload = gfind->second;
            } else {
                nlohmann::json json;
                json["name"] = std::string(message.payload.to_string());
                json["value"] = gfind->second;
                queryResp.payload = fileops::generateJsonString(json);
            }
        } else if (message.payload.to_string() == "list") {
            queryResp.payload = generateStringVector(global_values, [](const auto& globalValue) {
                return globalValue.first;
            });
        } else if (message.payload.to_string() == "all") {
            fileops::JsonMapBuilder globalSet;
            auto& json = globalSet.getJValue();
            for (auto& val : global_values) {
                json[val.first] = val.second;
            }
            queryResp.payload = globalSet.generate();
        } else {
            queryResp.payload =
                generateJsonErrorResponse(JsonErrorCodes::NOT_FOUND, "Global value not found");
        }
        if (queryResp.dest_id == global_broker_id_local) {
            activeQueries.setDelayedValue(message.messageID,
                                          std::string(queryResp.payload.to_string()));
        } else {
            transmit(getRoute(queryResp.dest_id), queryResp);
        }
    } else {
        route_id route = parent_route_id;
        auto fed = mFederates.find(target);
        std::string response;
        if (fed != mFederates.end()) {
            route = fed->route;
            message.dest_id = fed->parent;
            response = checkFedQuery(*fed, message.payload.to_string());
            if (response.empty() && fed->state >= ConnectionState::ERROR_STATE) {
                route = parent_route_id;
                switch (fed->state) {
                    case ConnectionState::ERROR_STATE:
                        response = generateJsonErrorResponse(JsonErrorCodes::SERVICE_UNAVAILABLE,
                                                             "federate is in error state");
                        break;
                    case ConnectionState::DISCONNECTED:
                    case ConnectionState::REQUEST_DISCONNECT:
                        response = generateJsonErrorResponse(JsonErrorCodes::SERVICE_UNAVAILABLE,
                                                             "federate is disconnected");
                        break;
                    default:
                        break;
                }
            }
        } else {
            auto broker = mBrokers.find(target);
            if (broker != mBrokers.end()) {
                route = broker->route;
                message.dest_id = broker->global_id;
                response = checkBrokerQuery(*broker, message.payload.to_string());
                if (response.empty() && broker->state >= ConnectionState::ERROR_STATE) {
                    route = parent_route_id;
                    switch (broker->state) {
                        case ConnectionState::ERROR_STATE:
                            response =
                                generateJsonErrorResponse(JsonErrorCodes::SERVICE_UNAVAILABLE,
                                                          "target broker is in error state");
                            break;
                        case ConnectionState::DISCONNECTED:
                        case ConnectionState::REQUEST_DISCONNECT:
                            response =
                                generateJsonErrorResponse(JsonErrorCodes::SERVICE_UNAVAILABLE,
                                                          "federate is disconnected");
                            break;
                        default:
                            break;
                    }
                }
            } else if (isRootc && message.payload.to_string() == "exists") {
                response = "false";
            }
        }
        if (((route == parent_route_id) && (isRootc)) || !response.empty()) {
            if (response.empty()) {
                response = generateJsonErrorResponse(JsonErrorCodes::NOT_FOUND, "query not valid");
            }
            ActionMessage queryResp(force_ordered ? CMD_QUERY_REPLY_ORDERED : CMD_QUERY_REPLY);
            queryResp.dest_id = message.source_id;
            queryResp.source_id = global_broker_id_local;
            queryResp.messageID = message.messageID;

            queryResp.payload = response;
            if (queryResp.dest_id == global_broker_id_local) {
                activeQueries.setDelayedValue(message.messageID,
                                              std::string(queryResp.payload.to_string()));
            } else {
                transmit(getRoute(queryResp.dest_id), queryResp);
            }
        } else {
            if (message.source_id == global_broker_id_local) {
                if (queryTimeouts.empty()) {
                    setTickForwarding(TickForwardingReasons::QUERY_TIMEOUT, true);
                }
                queryTimeouts.emplace_back(message.messageID, std::chrono::steady_clock::now());
            }
            transmit(route, message);
        }
    }
}